

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadRegionsBuilder.cpp
# Opt level: O0

void __thiscall ThreadRegionsBuilder::ThreadRegionsBuilder(ThreadRegionsBuilder *this,size_t size)

{
  key_equal *in_RSI;
  unordered_map<Node_*,_ThreadRegion_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<std::pair<Node_*const,_ThreadRegion_*>_>_>
  *in_RDI;
  key_equal *__eql;
  hasher *in_stack_ffffffffffffffd0;
  hasher *__hf;
  size_type in_stack_ffffffffffffffd8;
  
  __eql = in_RSI;
  std::allocator<std::pair<Node_*const,_ThreadRegion_*>_>::allocator
            ((allocator<std::pair<Node_*const,_ThreadRegion_*>_> *)0x1aaf0b);
  std::
  unordered_map<Node_*,_ThreadRegion_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<std::pair<Node_*const,_ThreadRegion_*>_>_>
  ::unordered_map(in_RDI,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,__eql,
                  (allocator_type *)0x1aaf28);
  std::allocator<std::pair<Node_*const,_ThreadRegion_*>_>::~allocator
            ((allocator<std::pair<Node_*const,_ThreadRegion_*>_> *)0x1aaf32);
  __hf = (hasher *)(in_RDI + 1);
  std::allocator<std::pair<Node_*const,_ThreadRegion_*>_>::allocator
            ((allocator<std::pair<Node_*const,_ThreadRegion_*>_> *)0x1aaf54);
  std::
  unordered_map<Node_*,_ThreadRegion_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<std::pair<Node_*const,_ThreadRegion_*>_>_>
  ::unordered_map(in_RDI,(size_type)in_RSI,__hf,__eql,(allocator_type *)0x1aaf72);
  std::allocator<std::pair<Node_*const,_ThreadRegion_*>_>::~allocator
            ((allocator<std::pair<Node_*const,_ThreadRegion_*>_> *)0x1aaf7c);
  std::set<ThreadRegion_*,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>::set
            ((set<ThreadRegion_*,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_> *)
             0x1aaf8a);
  return;
}

Assistant:

ThreadRegionsBuilder::ThreadRegionsBuilder(std::size_t size)
        : visitedNodeToRegionMap(size), examinedNodeToRegionMap(size) {}